

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Accuracy::Texture2DFilteringCase::deinit(Texture2DFilteringCase *this)

{
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
  local_20;
  __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
  local_18;
  iterator i;
  Texture2DFilteringCase *this_local;
  
  i._M_current = (Texture2D **)this;
  local_18._M_current =
       (Texture2D **)
       std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::begin(&this->m_textures);
  while( true ) {
    local_20._M_current =
         (Texture2D **)
         std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::end(&this->m_textures);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
              ::operator*(&local_18);
    if (*ppTVar2 != (Texture2D *)0x0) {
      (*(*ppTVar2)->_vptr_Texture2D[1])();
    }
    __gnu_cxx::
    __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
    ::operator++(&local_18,0);
  }
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::clear(&this->m_textures);
  deqp::gls::TextureTestUtil::TextureRenderer::clear(&this->m_renderer);
  return;
}

Assistant:

void Texture2DFilteringCase::deinit (void)
{
	for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
		delete *i;
	m_textures.clear();

	m_renderer.clear();
}